

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockComparatorCopierTest_shouldSupportConstParameters_TestShell::createTest
          (TEST_MockComparatorCopierTest_shouldSupportConstParameters_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                                  ,0x24e);
  TEST_MockComparatorCopierTest_shouldSupportConstParameters_Test::
  TEST_MockComparatorCopierTest_shouldSupportConstParameters_Test
            ((TEST_MockComparatorCopierTest_shouldSupportConstParameters_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockComparatorCopierTest, shouldSupportConstParameters)
{
    StubComparator comparator;
    mock().installComparator("SomeClass", comparator);

    SomeClass param;
    mock().expectOneCall("functionWithConstParam").withParameterOfType("SomeClass", "param", &param);
    functionWithConstParam(param);

    mock().checkExpectations();
}